

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

void report(long total_micros,int count)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = (double)total_micros / 1000000.0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    num: ",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", total_seconds: ",0x11);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", num_per_second: ",0x12);
  poVar1 = std::ostream::_M_insert<double>((double)count / dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", micros_per: ",0xe);
  poVar1 = std::ostream::_M_insert<double>((double)total_micros / (double)count);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void report(long total_micros, int count) {
  double total_seconds = static_cast<double>(total_micros) / 1e6;
  double num_per_second = count / total_seconds;
  double micros_per = static_cast<double>(total_micros) / count;
  std::cout << std::endl
            << "    num: " << count << ", total_seconds: " << total_seconds << ", num_per_second: " << num_per_second
            << ", micros_per: " << micros_per << std::endl;
}